

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void pbrt::DisplayStatic(string *title,Image *image,optional<pbrt::ImageChannelDesc> *channelDesc)

{
  undefined1 uVar1;
  optional<pbrt::ImageChannelDesc> *in_RDX;
  IPCChannel *in_RSI;
  DisplayItem *in_RDI;
  lock_guard<std::mutex> lock;
  DisplayItem item;
  optional<pbrt::ImageChannelDesc> *in_stack_00000218;
  Image *in_stack_00000220;
  string *in_stack_00000228;
  mutex_type *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  LogLevel in_stack_ffffffffffffff54;
  
  pstd::optional<pbrt::ImageChannelDesc>::optional
            ((optional<pbrt::ImageChannelDesc> *)in_RDI,in_RDX);
  GetImageDisplayItem(in_stack_00000228,in_stack_00000220,in_stack_00000218);
  pstd::optional<pbrt::ImageChannelDesc>::~optional((optional<pbrt::ImageChannelDesc> *)0x86096d);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0)
             ,in_stack_fffffffffffffee8);
  uVar1 = DisplayItem::Display(in_RDI,in_RSI);
  if ((!(bool)uVar1) && (LOGGING_LogLevel < 2)) {
    Log<std::__cxx11::string_const&>
              (in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x860a31);
  DisplayItem::~DisplayItem((DisplayItem *)CONCAT17(uVar1,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void DisplayStatic(const std::string &title, const Image &image,
                   pstd::optional<ImageChannelDesc> channelDesc) {
    DisplayItem item = GetImageDisplayItem(title, image, channelDesc);

    std::lock_guard<std::mutex> lock(mutex);
    if (!item.Display(*channel))
        LOG_ERROR("Unable to display static content \"%s\".", title);
}